

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# push_test.cc
# Opt level: O1

int main(void)

{
  pointer pPVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  PushBatchGetDevicesInfoRequestType *this;
  HttpTestListener *pHVar4;
  undefined8 extraout_RAX;
  PushBatchGetDevicesInfoResponseType resp;
  PushBatchGetDevicesInfoRequestType req;
  PushPushByteMessageResponseType resp_1;
  HttpTestListener *local_1c0;
  undefined1 local_1b8 [40];
  long *local_190;
  undefined8 local_188;
  long local_180;
  undefined1 local_178;
  undefined1 local_177;
  undefined7 *local_170;
  undefined8 local_168;
  undefined7 local_160;
  undefined1 uStack_159;
  undefined1 uStack_158;
  undefined2 uStack_157;
  undefined1 local_155;
  string local_150;
  string local_130;
  undefined1 local_110 [32];
  _Alloc_hider local_f0;
  size_type local_e8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_e0;
  _Alloc_hider local_d0;
  size_type local_c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c0;
  _Alloc_hider local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  _Alloc_hider local_90;
  size_type local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  PushPushByteMessageResponseType local_70;
  undefined1 *local_50;
  undefined8 local_48;
  undefined1 local_40;
  undefined7 uStack_3f;
  
  pPVar1 = (pointer)(local_110 + 0x10);
  local_110._8_8_ = (pointer)0x0;
  local_110[0x10] = '\0';
  local_f0._M_p = (pointer)&local_e0;
  local_e8 = 0;
  local_e0._M_local_buf[0] = '\0';
  local_1b8._16_8_ = (pointer)0x0;
  local_1b8._0_8_ = (pointer)0x0;
  local_1b8._8_8_ = (pointer)0x0;
  paVar2 = &local_70.response_id.field_2;
  local_70.response_id.field_2._M_local_buf[0] = 'c';
  local_70.response_id.field_2._M_allocated_capacity._1_6_ = 0x676e61682d6e;
  local_70.response_id.field_2._7_4_ = 0x756f687a;
  local_70.response_id._M_string_length = 0xb;
  local_70.response_id.field_2._M_local_buf[0xb] = '\0';
  local_160 = 0x697070615f796d;
  uStack_159 = 100;
  local_168 = 8;
  uStack_158 = 0;
  local_180 = 0x65726365735f796d;
  local_178 = 0x74;
  local_188 = 9;
  local_177 = 0;
  local_190 = &local_180;
  local_170 = &local_160;
  local_110._0_8_ = pPVar1;
  local_70.response_id._M_dataplus._M_p = (pointer)paVar2;
  this = (PushBatchGetDevicesInfoRequestType *)
         aliyun::Push::CreatePushClient(&local_70,&local_170,&local_190);
  if (local_190 != &local_180) {
    operator_delete(local_190,local_180 + 1);
  }
  if (local_170 != &local_160) {
    operator_delete(local_170,CONCAT17(uStack_159,local_160) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.response_id._M_dataplus._M_p != paVar2) {
    operator_delete(local_70.response_id._M_dataplus._M_p,
                    CONCAT17(local_70.response_id.field_2._M_local_buf[7],
                             CONCAT61(local_70.response_id.field_2._M_allocated_capacity._1_6_,
                                      local_70.response_id.field_2._M_local_buf[0])) + 1);
  }
  if (this == (PushBatchGetDevicesInfoRequestType *)0x0) {
    std::
    vector<aliyun::PushBatchGetDevicesInfoDeviceInfoType,_std::allocator<aliyun::PushBatchGetDevicesInfoDeviceInfoType>_>
    ::~vector((vector<aliyun::PushBatchGetDevicesInfoDeviceInfoType,_std::allocator<aliyun::PushBatchGetDevicesInfoDeviceInfoType>_>
               *)local_1b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_p != &local_e0) {
      operator_delete(local_f0._M_p,
                      CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]) + 1);
    }
    if ((pointer)local_110._0_8_ != pPVar1) {
      operator_delete((void *)local_110._0_8_,CONCAT71(local_110._17_7_,local_110[0x10]) + 1);
    }
    local_110._8_8_ = (pointer)0x0;
    local_110[0x10] = '\0';
    local_f0._M_p = (pointer)&local_e0;
    local_e8 = 0;
    local_e0._M_local_buf[0] = '\0';
    local_c8 = 0;
    local_c0._M_local_buf[0] = '\0';
    local_a8 = 0;
    local_a0._M_local_buf[0] = '\0';
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    local_70.response_id._M_string_length = 0;
    local_70.response_id.field_2._M_local_buf[0] = '\0';
    local_160 = 0x676e61682d6e63;
    uStack_159 = 0x7a;
    uStack_158 = 0x68;
    uStack_157 = 0x756f;
    local_168 = 0xb;
    local_155 = 0;
    local_180 = 0x64697070615f796d;
    local_188 = 8;
    local_178 = 0;
    paVar3 = &local_150.field_2;
    local_150.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
    local_150.field_2._M_local_buf[7] = 'e';
    local_150.field_2._M_local_buf[8] = 't';
    local_150._M_string_length = 9;
    local_150.field_2._M_local_buf[9] = '\0';
    local_190 = &local_180;
    local_170 = &local_160;
    local_150._M_dataplus._M_p = (pointer)paVar3;
    local_110._0_8_ = pPVar1;
    local_d0._M_p = (pointer)&local_c0;
    local_b0._M_p = (pointer)&local_a0;
    local_90._M_p = (pointer)&local_80;
    local_70.response_id._M_dataplus._M_p = (pointer)paVar2;
    pHVar4 = (HttpTestListener *)aliyun::Push::CreatePushClient(&local_170,&local_190,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != paVar3) {
      operator_delete(local_150._M_dataplus._M_p,
                      CONCAT17(local_150.field_2._M_local_buf[7],
                               local_150.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if (local_190 != &local_180) {
      operator_delete(local_190,local_180 + 1);
    }
    if (local_170 != &local_160) {
      operator_delete(local_170,CONCAT17(uStack_159,local_160) + 1);
    }
    local_1c0 = pHVar4;
    if (pHVar4 == (HttpTestListener *)0x0) {
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_70.response_id._M_dataplus._M_p != &local_70.response_id.field_2) {
        operator_delete(local_70.response_id._M_dataplus._M_p,
                        CONCAT17(local_70.response_id.field_2._M_local_buf[7],
                                 CONCAT61(local_70.response_id.field_2._M_allocated_capacity._1_6_,
                                          local_70.response_id.field_2._M_local_buf[0])) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_90._M_p != &local_80) {
        operator_delete(local_90._M_p,
                        CONCAT71(local_80._M_allocated_capacity._1_7_,local_80._M_local_buf[0]) + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b0._M_p != &local_a0) {
        operator_delete(local_b0._M_p,
                        CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0]) + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_d0._M_p != &local_c0) {
        operator_delete(local_d0._M_p,
                        CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0]) + 1)
        ;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_p != &local_e0) {
        operator_delete(local_f0._M_p,
                        CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]) + 1)
        ;
      }
      if ((pointer)local_110._0_8_ != (pointer)(local_110 + 0x10)) {
        operator_delete((void *)local_110._0_8_,CONCAT71(local_110._17_7_,local_110[0x10]) + 1);
      }
      local_110._8_8_ = (pointer)0x0;
      local_110[0x10] = '\0';
      local_f0._M_p = (pointer)&local_e0;
      local_e8 = 0;
      local_e0._M_local_buf[0] = '\0';
      local_c8 = 0;
      local_c0._M_local_buf[0] = '\0';
      local_a8 = 0;
      local_a0._M_local_buf[0] = '\0';
      local_70.response_id._M_dataplus._M_p = (pointer)&local_70.response_id.field_2;
      local_70.response_id._M_string_length = 0;
      local_70.response_id.field_2._M_local_buf[0] = '\0';
      local_48 = 0;
      local_40 = 0;
      local_160 = 0x676e61682d6e63;
      uStack_159 = 0x7a;
      uStack_158 = 0x68;
      uStack_157 = 0x756f;
      local_168 = 0xb;
      local_155 = 0;
      local_180 = 0x64697070615f796d;
      local_188 = 8;
      local_178 = 0;
      local_150.field_2._M_allocated_capacity._0_7_ = 0x726365735f796d;
      local_150.field_2._M_local_buf[7] = 'e';
      local_150.field_2._M_local_buf[8] = 't';
      local_150._M_string_length = 9;
      local_150.field_2._M_local_buf[9] = '\0';
      local_190 = &local_180;
      local_170 = &local_160;
      local_150._M_dataplus._M_p = (pointer)paVar3;
      local_110._0_8_ = (pointer)(local_110 + 0x10);
      local_d0._M_p = (pointer)&local_c0;
      local_b0._M_p = (pointer)&local_a0;
      local_50 = &local_40;
      pHVar4 = (HttpTestListener *)aliyun::Push::CreatePushClient();
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_150._M_dataplus._M_p != paVar3) {
        operator_delete(local_150._M_dataplus._M_p,
                        CONCAT17(local_150.field_2._M_local_buf[7],
                                 local_150.field_2._M_allocated_capacity._0_7_) + 1);
      }
      if (local_190 != &local_180) {
        operator_delete(local_190,local_180 + 1);
      }
      if (local_170 != &local_160) {
        operator_delete(local_170,CONCAT17(uStack_159,local_160) + 1);
      }
      local_1c0 = pHVar4;
      if (pHVar4 == (HttpTestListener *)0x0) {
        if (local_50 != &local_40) {
          operator_delete(local_50,CONCAT71(uStack_3f,local_40) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70.response_id._M_dataplus._M_p != &local_70.response_id.field_2) {
          operator_delete(local_70.response_id._M_dataplus._M_p,
                          CONCAT17(local_70.response_id.field_2._M_local_buf[7],
                                   CONCAT61(local_70.response_id.field_2._M_allocated_capacity._1_6_
                                            ,local_70.response_id.field_2._M_local_buf[0])) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b0._M_p != &local_a0) {
          operator_delete(local_b0._M_p,
                          CONCAT71(local_a0._M_allocated_capacity._1_7_,local_a0._M_local_buf[0]) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_p != &local_c0) {
          operator_delete(local_d0._M_p,
                          CONCAT71(local_c0._M_allocated_capacity._1_7_,local_c0._M_local_buf[0]) +
                          1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_f0._M_p != &local_e0) {
          operator_delete(local_f0._M_p,
                          CONCAT71(local_e0._M_allocated_capacity._1_7_,local_e0._M_local_buf[0]) +
                          1);
        }
        if ((pointer)local_110._0_8_ != (pointer)(local_110 + 0x10)) {
          operator_delete((void *)local_110._0_8_,CONCAT71(local_110._17_7_,local_110[0x10]) + 1);
        }
        return 0;
      }
      goto LAB_00103d1a;
    }
  }
  else {
    local_150.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
    local_150.field_2._M_local_buf[7] = '.';
    local_150.field_2._M_local_buf[8] = '1';
    local_150.field_2._M_local_buf[9] = ':';
    local_150.field_2._10_5_ = 0x3433323231;
    local_150._M_string_length = 0xf;
    local_150.field_2._M_local_buf[0xf] = '\0';
    local_150._M_dataplus._M_p = (pointer)&local_150.field_2;
    aliyun::Push::SetProxyHost((Push *)this,&local_150);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_150._M_dataplus._M_p != &local_150.field_2) {
      operator_delete(local_150._M_dataplus._M_p,
                      CONCAT17(local_150.field_2._M_local_buf[7],
                               local_150.field_2._M_allocated_capacity._0_7_) + 1);
    }
    if ((char)(this->app_id)._M_string_length == '\x01') {
      *(undefined1 *)((long)&(this->app_id)._M_string_length + 1) = 0;
    }
    pHVar4 = (HttpTestListener *)operator_new(0x180);
    HttpTestListener::HttpTestListener(pHVar4,0x2fca);
    local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_130,
               "{  \"DeviceInfos\": {    \"DeviceInfo\": [      {        \"DeviceId\": \"DeviceId\",        \"IsOnline\": true,        \"Status\": 0      }    ]  }}"
               ,"");
    HttpTestListener::SetResponseBody(pHVar4,&local_130);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != &local_130.field_2) {
      operator_delete(local_130._M_dataplus._M_p,
                      CONCAT17(local_130.field_2._M_local_buf[7],
                               local_130.field_2._M_allocated_capacity._0_7_) + 1);
    }
    HttpTestListener::Start(pHVar4);
    std::__cxx11::string::operator=((string *)local_110,"Devices");
    std::__cxx11::string::operator=((string *)&local_f0,"AppId");
    aliyun::Push::BatchGetDevicesInfo
              (this,(PushBatchGetDevicesInfoResponseType *)local_110,(PushErrorInfo *)local_1b8);
    HttpTestListener::WaitComplete(pHVar4);
    main_cold_1();
  }
  local_130.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
  local_130.field_2._M_local_buf[7] = '.';
  local_130.field_2._8_7_ = 0x34333232313a31;
  local_130._M_string_length = 0xf;
  local_130.field_2._M_local_buf[0xf] = '\0';
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  aliyun::Push::SetProxyHost((Push *)pHVar4,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,
                    CONCAT17(local_130.field_2._M_local_buf[7],
                             local_130.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((char)(local_1c0->request_url_)._M_string_length == '\x01') {
    *(undefined1 *)((long)&(local_1c0->request_url_)._M_string_length + 1) = 0;
  }
  pHVar4 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar4,0x2fca);
  local_1b8._0_8_ = (pointer)(local_1b8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b8,"{  \"ResponseId\": \"ResponseId\"}","");
  HttpTestListener::SetResponseBody(pHVar4,(string *)local_1b8);
  if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
  }
  HttpTestListener::Start(pHVar4);
  std::__cxx11::string::operator=((string *)local_110,"AppId");
  std::__cxx11::string::operator=((string *)&local_f0,"SendType");
  std::__cxx11::string::operator=((string *)&local_d0,"Accounts");
  std::__cxx11::string::operator=((string *)&local_b0,"DeviceIds");
  std::__cxx11::string::operator=((string *)&local_90,"PushContent");
  aliyun::Push::PushByteMessage
            ((Push *)local_1c0,(PushPushByteMessageRequestType *)local_110,&local_70,
             (PushErrorInfo *)0x0);
  HttpTestListener::WaitComplete(pHVar4);
  main_cold_2();
LAB_00103d1a:
  local_130.field_2._M_allocated_capacity._0_7_ = 0x302e302e373231;
  local_130.field_2._M_local_buf[7] = '.';
  local_130.field_2._8_7_ = 0x34333232313a31;
  local_130._M_string_length = 0xf;
  local_130.field_2._M_local_buf[0xf] = '\0';
  local_130._M_dataplus._M_p = (pointer)&local_130.field_2;
  aliyun::Push::SetProxyHost((Push *)pHVar4,&local_130);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_130._M_dataplus._M_p != &local_130.field_2) {
    operator_delete(local_130._M_dataplus._M_p,
                    CONCAT17(local_130.field_2._M_local_buf[7],
                             local_130.field_2._M_allocated_capacity._0_7_) + 1);
  }
  if ((char)(local_1c0->request_url_)._M_string_length == '\x01') {
    *(undefined1 *)((long)&(local_1c0->request_url_)._M_string_length + 1) = 0;
  }
  pHVar4 = (HttpTestListener *)operator_new(0x180);
  HttpTestListener::HttpTestListener(pHVar4,0x2fca);
  local_1b8._0_8_ = (pointer)(local_1b8 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_1b8,
             "{  \"RpcCode\": \"RpcCode\",  \"ResponseContent\": \"ResponseContent\"}","");
  HttpTestListener::SetResponseBody(pHVar4,(string *)local_1b8);
  if ((pointer)local_1b8._0_8_ != (pointer)(local_1b8 + 0x10)) {
    operator_delete((void *)local_1b8._0_8_,(ulong)(local_1b8._16_8_ + 1));
  }
  HttpTestListener::Start(pHVar4);
  std::__cxx11::string::operator=((string *)local_110,"AppId");
  std::__cxx11::string::operator=((string *)&local_f0,"DeviceId");
  std::__cxx11::string::operator=((string *)&local_d0,"RpcContent");
  std::__cxx11::string::operator=((string *)&local_b0,"TimeOut");
  aliyun::Push::RevertRpc
            ((PushRevertRpcRequestType *)local_1c0,(PushRevertRpcResponseType *)local_110,
             (PushErrorInfo *)&local_70);
  HttpTestListener::WaitComplete(pHVar4);
  main_cold_3();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70.response_id._M_dataplus._M_p != &local_70.response_id.field_2) {
    operator_delete(local_70.response_id._M_dataplus._M_p,
                    CONCAT17(local_70.response_id.field_2._M_local_buf[7],
                             CONCAT61(local_70.response_id.field_2._M_allocated_capacity._1_6_,
                                      local_70.response_id.field_2._M_local_buf[0])) + 1);
  }
  aliyun::PushPushByteMessageRequestType::~PushPushByteMessageRequestType
            ((PushPushByteMessageRequestType *)local_110);
  _Unwind_Resume(extraout_RAX);
}

Assistant:

int main() {
  test_batch_get_devices_info();
  test_push_byte_message();
  test_revert_rpc();
}